

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O0

string * __thiscall
enact::AstSerialise::visitStructStmt_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,StructStmt *stmt)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_> *this_00;
  reference pFVar4;
  pointer pTVar5;
  undefined4 extraout_var;
  Field *field;
  iterator __end1;
  iterator __begin1;
  vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_> *__range1;
  stringstream local_1a8 [8];
  stringstream s;
  ostream local_198 [376];
  StructStmt *local_20;
  StructStmt *stmt_local;
  AstSerialise *this_local;
  
  local_20 = stmt;
  stmt_local = (StructStmt *)this;
  this_local = (AstSerialise *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar3 = std::operator<<(local_198,(string *)&this->m_ident);
  poVar3 = std::operator<<(poVar3,"(Stmt::Struct ");
  poVar3 = std::operator<<(poVar3,(string *)&(local_20->name).lexeme);
  std::operator<<(poVar3," (");
  std::operator<<(local_198,") (\n");
  std::__cxx11::string::operator+=((string *)&this->m_ident,"    ");
  this_00 = &local_20->fields;
  __end1 = std::vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>::begin
                     (this_00);
  field = (Field *)std::vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>
                   ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<enact::StructStmt::Field_*,_std::vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>_>
                                *)&field);
    if (!bVar1) break;
    pFVar4 = __gnu_cxx::
             __normal_iterator<enact::StructStmt::Field_*,_std::vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>_>
             ::operator*(&__end1);
    poVar3 = std::operator<<(local_198,(string *)&this->m_ident);
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = std::operator<<(poVar3,(string *)&(pFVar4->name).lexeme);
    poVar3 = std::operator<<(poVar3," ");
    pTVar5 = std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
             operator->(&pFVar4->typename_);
    iVar2 = (*pTVar5->_vptr_Typename[4])();
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
    std::operator<<(poVar3,")\n");
    __gnu_cxx::
    __normal_iterator<enact::StructStmt::Field_*,_std::vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::erase((ulong)&this->m_ident,0);
  std::operator<<(local_198,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitStructStmt(StructStmt &stmt) {
        std::stringstream s;
        s << m_ident << "(Stmt::Struct " << stmt.name.lexeme << " (";

        s << ") (\n";
        m_ident += "    ";

        for (auto &field : stmt.fields) {
            s << m_ident << "(" << field.name.lexeme << " " << field.typename_->name() << ")\n";
        }

        m_ident.erase(0, 4);
        s << ")";

        return s.str();
    }